

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

void __thiscall
flatbuffers::dart::DartGenerator::GenObjectBuilder
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *builder_name,string *code)

{
  IdlNamer *pIVar1;
  bool bVar2;
  FieldDef *pFVar3;
  Namespace *pNVar4;
  string *psVar5;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *pvVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  size_type *psVar10;
  pointer ppVar11;
  ulong uVar12;
  undefined8 uVar13;
  char *pcVar14;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string *local_128;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  DartGenerator *local_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  string local_b8;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_98;
  IdlNamer *local_90;
  StructDef *local_88;
  pointer local_80;
  string local_78;
  string local_58;
  string *local_38;
  
  local_128 = code;
  local_e0 = this;
  local_88 = struct_def;
  std::operator+(&local_100,"class ",builder_name);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_110 = *puVar9;
    lStack_108 = plVar7[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *puVar9;
    local_120 = (ulong *)*plVar7;
  }
  local_118 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,_kFb_abi_cxx11_);
  puVar9 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_148.field_2._M_allocated_capacity = *puVar9;
    local_148.field_2._8_8_ = puVar8[3];
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  }
  else {
    local_148.field_2._M_allocated_capacity = *puVar9;
    local_148._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_148._M_string_length = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168.field_2._8_8_ = plVar7[3];
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_168._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_128,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  local_38 = builder_name;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  ppVar11 = (non_deprecated_fields->
            super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_98 = non_deprecated_fields;
  if (ppVar11 !=
      (non_deprecated_fields->
      super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_90 = &local_e0->namer_;
    do {
      pFVar3 = ppVar11->second;
      pNVar4 = (local_88->super_Definition).defined_namespace;
      bVar2 = local_88->fixed;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_80 = ppVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ObjectBuilder","");
      GenDartTypeName(&local_b8,local_e0,&(pFVar3->value).type,pNVar4,pFVar3,(bool)(bVar2 ^ 1),
                      &local_58);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x366738);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_100.field_2._M_allocated_capacity = *psVar10;
        local_100.field_2._8_8_ = plVar7[3];
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar10;
        local_100._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_100._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
      puVar9 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar9) {
        local_110 = *puVar9;
        lStack_108 = plVar7[3];
        local_120 = &local_110;
      }
      else {
        local_110 = *puVar9;
        local_120 = (ulong *)*plVar7;
      }
      local_118 = plVar7[1];
      *plVar7 = (long)puVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      (*(local_90->super_Namer)._vptr_Namer[7])(&local_d8,local_90,pFVar3);
      uVar12 = 0xf;
      if (local_120 != &local_110) {
        uVar12 = local_110;
      }
      if (uVar12 < (ulong)(local_d0 + local_118)) {
        uVar12 = 0xf;
        if (local_d8 != local_c8) {
          uVar12 = local_c8[0];
        }
        if (uVar12 < (ulong)(local_d0 + local_118)) goto LAB_001cfe66;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_120);
      }
      else {
LAB_001cfe66:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_d8);
      }
      puVar9 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_148.field_2._M_allocated_capacity = *puVar9;
        local_148.field_2._8_8_ = puVar8[3];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar9;
        local_148._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_148._M_string_length = puVar8[1];
      *puVar8 = puVar9;
      puVar8[1] = 0;
      *(undefined1 *)puVar9 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_168.field_2._M_allocated_capacity = *psVar10;
        local_168.field_2._8_8_ = plVar7[3];
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar10;
        local_168._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_168._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_128,(ulong)local_168._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      non_deprecated_fields = local_98;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      ppVar11 = local_80 + 1;
    } while (ppVar11 !=
             (non_deprecated_fields->
             super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)local_128);
  std::operator+(&local_148,"  ",local_38);
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168.field_2._8_8_ = puVar8[3];
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_168._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_128,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((non_deprecated_fields->
      super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (non_deprecated_fields->
      super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::append((char *)local_128);
  }
  else {
    std::__cxx11::string::append((char *)local_128);
    ppVar11 = (non_deprecated_fields->
              super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppVar11 !=
        (non_deprecated_fields->
        super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_90 = &local_e0->namer_;
      do {
        pFVar3 = ppVar11->second;
        local_80 = ppVar11;
        std::__cxx11::string::append((char *)local_128);
        bVar2 = local_88->fixed;
        pcVar14 = "";
        if (bVar2 != false) {
          pcVar14 = "required ";
        }
        pNVar4 = (local_88->super_Definition).defined_namespace;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ObjectBuilder","");
        GenDartTypeName(&local_b8,local_e0,&(pFVar3->value).type,pNVar4,pFVar3,(bool)(bVar2 ^ 1),
                        &local_78);
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_b8,0,(char *)0x0,(ulong)pcVar14);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_100.field_2._M_allocated_capacity = *psVar10;
          local_100.field_2._8_8_ = plVar7[3];
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        }
        else {
          local_100.field_2._M_allocated_capacity = *psVar10;
          local_100._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_100._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
        puVar9 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar9) {
          local_110 = *puVar9;
          lStack_108 = plVar7[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *puVar9;
          local_120 = (ulong *)*plVar7;
        }
        local_118 = plVar7[1];
        *plVar7 = (long)puVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        (*(local_90->super_Namer)._vptr_Namer[7])(&local_d8,local_90,pFVar3);
        uVar12 = 0xf;
        if (local_120 != &local_110) {
          uVar12 = local_110;
        }
        if (uVar12 < (ulong)(local_d0 + local_118)) {
          uVar12 = 0xf;
          if (local_d8 != local_c8) {
            uVar12 = local_c8[0];
          }
          if (uVar12 < (ulong)(local_d0 + local_118)) goto LAB_001d02fe;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_120);
        }
        else {
LAB_001d02fe:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_d8)
          ;
        }
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_148.field_2._M_allocated_capacity = *puVar9;
          local_148.field_2._8_8_ = puVar8[3];
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar9;
          local_148._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_148._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_168.field_2._M_allocated_capacity = *psVar10;
          local_168.field_2._8_8_ = puVar8[3];
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar10;
          local_168._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_168._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_128,(ulong)local_168._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120,local_110 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        non_deprecated_fields = local_98;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        ppVar11 = local_80 + 1;
      } while (ppVar11 !=
               (non_deprecated_fields->
               super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    psVar5 = local_128;
    std::__cxx11::string::append((char *)local_128);
    std::__cxx11::string::append((char *)psVar5);
    ppVar11 = (non_deprecated_fields->
              super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppVar11 !=
        (non_deprecated_fields->
        super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pIVar1 = &local_e0->namer_;
      do {
        pFVar3 = ppVar11->second;
        (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_100,pIVar1,pFVar3);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x36223c);
        local_120 = &local_110;
        puVar9 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar9) {
          local_110 = *puVar9;
          lStack_108 = plVar7[3];
        }
        else {
          local_110 = *puVar9;
          local_120 = (ulong *)*plVar7;
        }
        local_118 = plVar7[1];
        *plVar7 = (long)puVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_148.field_2._M_allocated_capacity = *puVar9;
          local_148.field_2._8_8_ = puVar8[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar9;
          local_148._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_148._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_b8,pIVar1,pFVar3);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          uVar13 = local_148.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_b8._M_string_length + local_148._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            uVar13 = local_b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_b8._M_string_length + local_148._M_string_length)
          goto LAB_001d0638;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_b8,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
        }
        else {
LAB_001d0638:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_148,(ulong)local_b8._M_dataplus._M_p);
        }
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_168.field_2._M_allocated_capacity = *psVar10;
          local_168.field_2._8_8_ = puVar8[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar10;
          local_168._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_168._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)psVar10 = 0;
        std::__cxx11::string::_M_append((char *)local_128,(ulong)local_168._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120,local_110 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        pvVar6 = local_98;
        std::__cxx11::string::append((char *)local_128);
        ppVar11 = ppVar11 + 1;
      } while (ppVar11 !=
               (pvVar6->
               super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  psVar5 = local_128;
  std::__cxx11::string::append((char *)local_128);
  std::__cxx11::string::append((char *)psVar5);
  std::operator+(&local_148,"  int finish(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_kFb_abi_cxx11_);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
  pvVar6 = local_98;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168.field_2._8_8_ = plVar7[3];
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_168._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_128,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  GenObjectBuilderImplementation_abi_cxx11_(&local_168,local_e0,local_88,pvVar6,true,false);
  std::__cxx11::string::_M_append((char *)local_128,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  psVar5 = local_128;
  std::__cxx11::string::append((char *)local_128);
  std::__cxx11::string::append((char *)psVar5);
  std::__cxx11::string::append((char *)psVar5);
  std::__cxx11::string::append((char *)psVar5);
  std::operator+(&local_148,"    final fbBuilder = ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_kFb_abi_cxx11_);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168.field_2._8_8_ = plVar7[3];
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_168._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_128,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  psVar5 = local_128;
  std::__cxx11::string::append((char *)local_128);
  std::__cxx11::string::append((char *)psVar5);
  std::__cxx11::string::append((char *)psVar5);
  std::__cxx11::string::append((char *)psVar5);
  return;
}

Assistant:

void GenObjectBuilder(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      const std::string &builder_name, std::string &code) {
    code += "class " + builder_name + " extends " + _kFb + ".ObjectBuilder {\n";
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      code += "  final " +
              GenDartTypeName(field.value.type, struct_def.defined_namespace,
                              field, !struct_def.fixed, "ObjectBuilder") +
              " _" + namer_.Variable(field) + ";\n";
    }
    code += "\n";
    code += "  " + builder_name + "(";

    if (non_deprecated_fields.size() != 0) {
      code += "{\n";
      for (auto it = non_deprecated_fields.begin();
           it != non_deprecated_fields.end(); ++it) {
        const FieldDef &field = *it->second;

        code += "    ";
        code += (struct_def.fixed ? "required " : "") +
                GenDartTypeName(field.value.type, struct_def.defined_namespace,
                                field, !struct_def.fixed, "ObjectBuilder") +
                " " + namer_.Variable(field) + ",\n";
      }
      code += "  })\n";
      code += "      : ";
      for (auto it = non_deprecated_fields.begin();
           it != non_deprecated_fields.end(); ++it) {
        const FieldDef &field = *it->second;

        code += "_" + namer_.Variable(field) + " = " + namer_.Variable(field);
        if (it == non_deprecated_fields.end() - 1) {
          code += ";\n\n";
        } else {
          code += ",\n        ";
        }
      }
    } else {
      code += ");\n\n";
    }

    code += "  /// Finish building, and store into the [fbBuilder].\n";
    code += "  @override\n";
    code += "  int finish(" + _kFb + ".Builder fbBuilder) {\n";
    code += GenObjectBuilderImplementation(struct_def, non_deprecated_fields);
    code += "  }\n\n";

    code += "  /// Convenience method to serialize to byte list.\n";
    code += "  @override\n";
    code += "  Uint8List toBytes([String? fileIdentifier]) {\n";
    code += "    final fbBuilder = " + _kFb +
            ".Builder(deduplicateTables: false);\n";
    code += "    fbBuilder.finish(finish(fbBuilder), fileIdentifier);\n";
    code += "    return fbBuilder.buffer;\n";
    code += "  }\n";
    code += "}\n";
  }